

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O1

int megumax::eval(Position *pos)

{
  int iVar1;
  PieceType pt;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  Square sq;
  long lVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  ushort uVar13;
  undefined1 auVar18 [12];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  char cVar25;
  byte bVar32;
  char cVar33;
  byte bVar34;
  char cVar35;
  byte bVar36;
  char cVar37;
  byte bVar38;
  char cVar39;
  byte bVar40;
  undefined1 auVar26 [12];
  undefined1 auVar30 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined4 uVar14;
  undefined6 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [12];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  undefined1 auVar22 [16];
  undefined1 auVar27 [12];
  undefined1 auVar28 [14];
  undefined1 auVar29 [14];
  undefined1 auVar31 [16];
  
  iVar5 = 0;
  iVar3 = 0;
  iVar8 = 0;
  lVar9 = 0;
  do {
    iVar1 = *(int *)((long)&libchess::constants::COLORS + lVar9);
    lVar7 = 0;
    iVar10 = iVar5;
    iVar12 = iVar3;
    do {
      pt.super_MetaValueType<int>.value_ =
           (MetaValueType<int>)
           ((MetaValueType<int> *)((long)&libchess::constants::PIECE_TYPES + lVar7))->value_;
      uVar11 = pos->piece_type_bb_[(int)pt.super_MetaValueType<int>.value_].value_ &
               pos->color_bb_[iVar1].value_;
      uVar6 = uVar11 - (uVar11 >> 1 & 0x5555555555555555);
      uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333);
      iVar5 = *(int *)(piece_values + (long)(int)pt.super_MetaValueType<int>.value_ * 4);
      for (; uVar11 != 0; uVar11 = uVar11 & uVar11 - 1) {
        lVar2 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        sq.super_MetaValueType<int>.value_ =
             (MetaValueType<int>)(MetaValueType<int>)((value_type)lVar2 ^ 0x38);
        if (iVar1 == 0) {
          sq.super_MetaValueType<int>.value_ =
               (MetaValueType<int>)(MetaValueType<int>)(value_type)lVar2;
        }
        iVar3 = pst_mg(pt,sq);
        iVar4 = pst_eg(pt,sq);
        iVar12 = iVar12 + iVar3;
        iVar8 = iVar8 + iVar4;
      }
      iVar10 = iVar10 + (uint)(byte)(((uVar6 >> 4) + uVar6 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101
                                    >> 0x38) * iVar5;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x18);
    iVar5 = -iVar10;
    iVar3 = -iVar12;
    iVar8 = -iVar8;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 8);
  auVar41 = *(undefined1 (*) [16])(pos->piece_type_bb_ + 1);
  auVar21 = *(undefined1 (*) [16])(pos->piece_type_bb_ + 3);
  auVar23._0_2_ = auVar41._0_2_ >> 1;
  auVar23._2_2_ = auVar41._2_2_ >> 1;
  auVar23._4_2_ = auVar41._4_2_ >> 1;
  auVar23._6_2_ = auVar41._6_2_ >> 1;
  auVar23._8_2_ = auVar41._8_2_ >> 1;
  auVar23._10_2_ = auVar41._10_2_ >> 1;
  auVar23._12_2_ = auVar41._12_2_ >> 1;
  auVar23._14_2_ = auVar41._14_2_ >> 1;
  auVar23 = auVar23 & _DAT_00118280;
  uVar13 = CONCAT11(auVar41[1] - auVar23[1],auVar41[0] - auVar23[0]);
  uVar14 = CONCAT13(auVar41[3] - auVar23[3],CONCAT12(auVar41[2] - auVar23[2],uVar13));
  uVar15 = CONCAT15(auVar41[5] - auVar23[5],CONCAT14(auVar41[4] - auVar23[4],uVar14));
  uVar16 = CONCAT17(auVar41[7] - auVar23[7],CONCAT16(auVar41[6] - auVar23[6],uVar15));
  auVar26._0_10_ = CONCAT19(auVar41[9] - auVar23[9],CONCAT18(auVar41[8] - auVar23[8],uVar16));
  auVar26[10] = auVar41[10] - auVar23[10];
  auVar26[0xb] = auVar41[0xb] - auVar23[0xb];
  auVar28[0xc] = auVar41[0xc] - auVar23[0xc];
  auVar28._0_12_ = auVar26;
  auVar28[0xd] = auVar41[0xd] - auVar23[0xd];
  auVar43[0xe] = auVar41[0xe] - auVar23[0xe];
  auVar43._0_14_ = auVar28;
  auVar43[0xf] = auVar41[0xf] - auVar23[0xf];
  auVar41 = auVar43 & _DAT_00118290;
  auVar30._0_2_ = uVar13 >> 2;
  auVar30._2_2_ = (ushort)((uint)uVar14 >> 0x12);
  auVar30._4_2_ = (ushort)((uint6)uVar15 >> 0x22);
  auVar30._6_2_ = (ushort)((ulong)uVar16 >> 0x32);
  auVar30._8_2_ = (ushort)((unkuint10)auVar26._0_10_ >> 0x42);
  auVar30._10_2_ = auVar26._10_2_ >> 2;
  auVar30._12_2_ = auVar28._12_2_ >> 2;
  auVar30._14_2_ = auVar43._14_2_ >> 2;
  auVar30 = auVar30 & _DAT_00118290;
  cVar25 = auVar30[0] + auVar41[0];
  bVar32 = auVar30[1] + auVar41[1];
  uVar13 = CONCAT11(bVar32,cVar25);
  cVar33 = auVar30[2] + auVar41[2];
  bVar34 = auVar30[3] + auVar41[3];
  uVar14 = CONCAT13(bVar34,CONCAT12(cVar33,uVar13));
  cVar35 = auVar30[4] + auVar41[4];
  bVar36 = auVar30[5] + auVar41[5];
  uVar15 = CONCAT15(bVar36,CONCAT14(cVar35,uVar14));
  cVar37 = auVar30[6] + auVar41[6];
  bVar38 = auVar30[7] + auVar41[7];
  uVar16 = CONCAT17(bVar38,CONCAT16(cVar37,uVar15));
  cVar39 = auVar30[8] + auVar41[8];
  bVar40 = auVar30[9] + auVar41[9];
  auVar27._0_10_ = CONCAT19(bVar40,CONCAT18(cVar39,uVar16));
  auVar27[10] = auVar30[10] + auVar41[10];
  auVar27[0xb] = auVar30[0xb] + auVar41[0xb];
  auVar29[0xc] = auVar30[0xc] + auVar41[0xc];
  auVar29._0_12_ = auVar27;
  auVar29[0xd] = auVar30[0xd] + auVar41[0xd];
  auVar31[0xe] = auVar30[0xe] + auVar41[0xe];
  auVar31._0_14_ = auVar29;
  auVar31[0xf] = auVar30[0xf] + auVar41[0xf];
  auVar42[0] = (char)(uVar13 >> 4) + cVar25;
  auVar42[1] = (bVar32 >> 4) + bVar32;
  auVar42[2] = (char)(ushort)((uint)uVar14 >> 0x14) + cVar33;
  auVar42[3] = (bVar34 >> 4) + bVar34;
  auVar42[4] = (char)(ushort)((uint6)uVar15 >> 0x24) + cVar35;
  auVar42[5] = (bVar36 >> 4) + bVar36;
  auVar42[6] = (char)(ushort)((ulong)uVar16 >> 0x34) + cVar37;
  auVar42[7] = (bVar38 >> 4) + bVar38;
  auVar42[8] = (char)(ushort)((unkuint10)auVar27._0_10_ >> 0x44) + cVar39;
  auVar42[9] = (bVar40 >> 4) + bVar40;
  auVar42[10] = (char)(auVar27._10_2_ >> 4) + auVar27[10];
  auVar42[0xb] = (auVar27[0xb] >> 4) + auVar27[0xb];
  auVar42[0xc] = (char)(auVar29._12_2_ >> 4) + auVar29[0xc];
  auVar42[0xd] = (auVar29[0xd] >> 4) + auVar29[0xd];
  auVar42[0xe] = (char)(auVar31._14_2_ >> 4) + auVar31[0xe];
  auVar42[0xf] = (auVar31[0xf] >> 4) + auVar31[0xf];
  auVar43 = psadbw(auVar42 & _DAT_001182a0,(undefined1  [16])0x0);
  auVar44._0_2_ = auVar21._0_2_ >> 1;
  auVar44._2_2_ = auVar21._2_2_ >> 1;
  auVar44._4_2_ = auVar21._4_2_ >> 1;
  auVar44._6_2_ = auVar21._6_2_ >> 1;
  auVar44._8_2_ = auVar21._8_2_ >> 1;
  auVar44._10_2_ = auVar21._10_2_ >> 1;
  auVar44._12_2_ = auVar21._12_2_ >> 1;
  auVar44._14_2_ = auVar21._14_2_ >> 1;
  auVar44 = auVar44 & _DAT_00118280;
  uVar13 = CONCAT11(auVar21[1] - auVar44[1],auVar21[0] - auVar44[0]);
  uVar14 = CONCAT13(auVar21[3] - auVar44[3],CONCAT12(auVar21[2] - auVar44[2],uVar13));
  uVar15 = CONCAT15(auVar21[5] - auVar44[5],CONCAT14(auVar21[4] - auVar44[4],uVar14));
  uVar16 = CONCAT17(auVar21[7] - auVar44[7],CONCAT16(auVar21[6] - auVar44[6],uVar15));
  auVar17._0_10_ = CONCAT19(auVar21[9] - auVar44[9],CONCAT18(auVar21[8] - auVar44[8],uVar16));
  auVar17[10] = auVar21[10] - auVar44[10];
  auVar17[0xb] = auVar21[0xb] - auVar44[0xb];
  auVar19[0xc] = auVar21[0xc] - auVar44[0xc];
  auVar19._0_12_ = auVar17;
  auVar19[0xd] = auVar21[0xd] - auVar44[0xd];
  auVar41[0xe] = auVar21[0xe] - auVar44[0xe];
  auVar41._0_14_ = auVar19;
  auVar41[0xf] = auVar21[0xf] - auVar44[0xf];
  auVar23 = auVar41 & _DAT_00118290;
  auVar21._0_2_ = uVar13 >> 2;
  auVar21._2_2_ = (ushort)((uint)uVar14 >> 0x12);
  auVar21._4_2_ = (ushort)((uint6)uVar15 >> 0x22);
  auVar21._6_2_ = (ushort)((ulong)uVar16 >> 0x32);
  auVar21._8_2_ = (ushort)((unkuint10)auVar17._0_10_ >> 0x42);
  auVar21._10_2_ = auVar17._10_2_ >> 2;
  auVar21._12_2_ = auVar19._12_2_ >> 2;
  auVar21._14_2_ = auVar41._14_2_ >> 2;
  auVar21 = auVar21 & _DAT_00118290;
  cVar25 = auVar21[0] + auVar23[0];
  bVar32 = auVar21[1] + auVar23[1];
  uVar13 = CONCAT11(bVar32,cVar25);
  cVar33 = auVar21[2] + auVar23[2];
  bVar34 = auVar21[3] + auVar23[3];
  uVar14 = CONCAT13(bVar34,CONCAT12(cVar33,uVar13));
  cVar35 = auVar21[4] + auVar23[4];
  bVar36 = auVar21[5] + auVar23[5];
  uVar15 = CONCAT15(bVar36,CONCAT14(cVar35,uVar14));
  cVar37 = auVar21[6] + auVar23[6];
  bVar38 = auVar21[7] + auVar23[7];
  uVar16 = CONCAT17(bVar38,CONCAT16(cVar37,uVar15));
  cVar39 = auVar21[8] + auVar23[8];
  bVar40 = auVar21[9] + auVar23[9];
  auVar18._0_10_ = CONCAT19(bVar40,CONCAT18(cVar39,uVar16));
  auVar18[10] = auVar21[10] + auVar23[10];
  auVar18[0xb] = auVar21[0xb] + auVar23[0xb];
  auVar20[0xc] = auVar21[0xc] + auVar23[0xc];
  auVar20._0_12_ = auVar18;
  auVar20[0xd] = auVar21[0xd] + auVar23[0xd];
  auVar22[0xe] = auVar21[0xe] + auVar23[0xe];
  auVar22._0_14_ = auVar20;
  auVar22[0xf] = auVar21[0xf] + auVar23[0xf];
  auVar24[0] = (char)(uVar13 >> 4) + cVar25;
  auVar24[1] = (bVar32 >> 4) + bVar32;
  auVar24[2] = (char)(ushort)((uint)uVar14 >> 0x14) + cVar33;
  auVar24[3] = (bVar34 >> 4) + bVar34;
  auVar24[4] = (char)(ushort)((uint6)uVar15 >> 0x24) + cVar35;
  auVar24[5] = (bVar36 >> 4) + bVar36;
  auVar24[6] = (char)(ushort)((ulong)uVar16 >> 0x34) + cVar37;
  auVar24[7] = (bVar38 >> 4) + bVar38;
  auVar24[8] = (char)(ushort)((unkuint10)auVar18._0_10_ >> 0x44) + cVar39;
  auVar24[9] = (bVar40 >> 4) + bVar40;
  auVar24[10] = (char)(auVar18._10_2_ >> 4) + auVar18[10];
  auVar24[0xb] = (auVar18[0xb] >> 4) + auVar18[0xb];
  auVar24[0xc] = (char)(auVar20._12_2_ >> 4) + auVar20[0xc];
  auVar24[0xd] = (auVar20[0xd] >> 4) + auVar20[0xd];
  auVar24[0xe] = (char)(auVar22._14_2_ >> 4) + auVar22[0xe];
  auVar24[0xf] = (auVar22[0xf] >> 4) + auVar22[0xf];
  auVar41 = psadbw(auVar24 & _DAT_001182a0,(undefined1  [16])0x0);
  iVar5 = 0x180c - (auVar41._0_4_ * 0x200 + auVar41._8_4_ * 0x400 +
                   (auVar43._8_4_ + auVar43._0_4_) * 0x100);
  iVar3 = iVar5 >> 0x1f;
  iVar5 = iVar5 / 0x18 + iVar3;
  iVar12 = ((iVar5 - iVar3) + -0x100) * iVar12;
  iVar8 = (iVar5 - iVar3) * iVar8;
  iVar5 = iVar12 + iVar8;
  iVar8 = iVar12 + iVar8 + 0xff;
  if (-1 < iVar5) {
    iVar8 = iVar5;
  }
  iVar10 = (iVar8 >> 8) - iVar10;
  iVar8 = -iVar10;
  if ((pos->side_to_move_).super_MetaValueType<int>.value_ == 0) {
    iVar8 = iVar10;
  }
  return iVar8;
}

Assistant:

int eval(const Position& pos) {
    int score = 0;
    int mg_score = 0;
    int eg_score = 0;

    for (Color color : constants::COLORS) {
        for (PieceType piece_type : constants::PIECE_TYPES) {
            Bitboard piece_bb = pos.piece_type_bb(piece_type, color);

            // Material
            score += piece_values[piece_type.value()] * piece_bb.popcount();

            while (piece_bb) {
                Square piece_sq = piece_bb.forward_bitscan();
                piece_bb.forward_popbit();

                // PST
                if (color == constants::WHITE) {
                    mg_score += pst_mg(piece_type, piece_sq);
                    eg_score += pst_eg(piece_type, piece_sq);
                } else {
                    mg_score += pst_mg(piece_type, piece_sq.flipped());
                    eg_score += pst_eg(piece_type, piece_sq.flipped());
                }
            }
        }

        score = -score;
        mg_score = -mg_score;
        eg_score = -eg_score;
    }

    // Phase
    const int p = phase(pos);
    score += ((mg_score * (256 - p)) + (eg_score * p)) / 256;

    // Return from side to move's pov
    if (pos.side_to_move() != constants::WHITE) {
        score = -score;
    }

    return score;
}